

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O2

RTCSubdivisionMode embree::parseSubdivMode(Ref<embree::XML> *xml)

{
  XML *this;
  bool bVar1;
  runtime_error *this_00;
  RTCSubdivisionMode RVar2;
  allocator local_59;
  string subdiv_mode;
  string local_38;
  
  this = xml->ptr;
  std::__cxx11::string::string((string *)&local_38,"subdiv_mode",&local_59);
  XML::parm(&subdiv_mode,this,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  bVar1 = std::operator==(&subdiv_mode,"no_boundary");
  RVar2 = RTC_SUBDIVISION_MODE_NO_BOUNDARY;
  if (!bVar1) {
    bVar1 = std::operator==(&subdiv_mode,"smooth");
    RVar2 = RTC_SUBDIVISION_MODE_SMOOTH_BOUNDARY;
    if (!bVar1) {
      bVar1 = std::operator==(&subdiv_mode,"pin_corners");
      if (bVar1) {
        RVar2 = RTC_SUBDIVISION_MODE_PIN_CORNERS;
      }
      else {
        bVar1 = std::operator==(&subdiv_mode,"pin_boundary");
        if (bVar1) {
          RVar2 = RTC_SUBDIVISION_MODE_PIN_BOUNDARY;
        }
        else {
          bVar1 = std::operator==(&subdiv_mode,"pin_all");
          if (bVar1) {
            RVar2 = RTC_SUBDIVISION_MODE_PIN_ALL;
          }
          else {
            bVar1 = std::operator!=(&subdiv_mode,"");
            if (bVar1) {
              this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::operator+(&local_38,"invalid subdivision mode: ",&subdiv_mode);
              std::runtime_error::runtime_error(this_00,(string *)&local_38);
              __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
          }
        }
      }
    }
  }
  std::__cxx11::string::~string((string *)&subdiv_mode);
  return RVar2;
}

Assistant:

Vec3f getVec3fa() const { return Vec3fa(f[0],f[1],f[2]); }